

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O0

QDataStream * operator<<(QDataStream *out,QHostAddress *address)

{
  NetworkLayerProtocol NVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  int i;
  qint8 prot;
  Q_IPV6ADDR ipv6;
  quint32 in_stack_ffffffffffffff8c;
  QDataStream *in_stack_ffffffffffffff90;
  QHostAddress *in_stack_ffffffffffffff98;
  QDataStream *pQVar2;
  int local_48;
  undefined1 local_30 [24];
  QIPv6Address local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  NVar1 = QHostAddress::protocol((QHostAddress *)0x2187cf);
  QDataStream::operator<<(in_RDI,(int)(char)NVar1);
  NVar1 = QHostAddress::protocol((QHostAddress *)0x2187ec);
  switch((QHostAddress *)(ulong)(uint)(NVar1 + IPv6Protocol)) {
  case (QHostAddress *)0x0:
  case (QHostAddress *)0x3:
    break;
  case (QHostAddress *)0x1:
    QHostAddress::toIPv4Address((QHostAddress *)(ulong)(uint)(NVar1 + IPv6Protocol),(bool *)in_RDI);
    QDataStream::operator<<(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
    break;
  case (QHostAddress *)0x2:
    local_18.c[8] = 0xaa;
    local_18.c[9] = 0xaa;
    local_18.c[10] = 0xaa;
    local_18.c[0xb] = 0xaa;
    local_18.c[0xc] = 0xaa;
    local_18.c[0xd] = 0xaa;
    local_18.c[0xe] = 0xaa;
    local_18.c[0xf] = 0xaa;
    local_18.c[0] = 0xaa;
    local_18.c[1] = 0xaa;
    local_18.c[2] = 0xaa;
    local_18.c[3] = 0xaa;
    local_18.c[4] = 0xaa;
    local_18.c[5] = 0xaa;
    local_18.c[6] = 0xaa;
    local_18.c[7] = 0xaa;
    local_18.c = (quint8  [16])QHostAddress::toIPv6Address(in_stack_ffffffffffffff98);
    for (local_48 = 0; local_48 < 0x10; local_48 = local_48 + 1) {
      QIPv6Address::operator[](&local_18,local_48);
      QDataStream::operator<<(in_stack_ffffffffffffff90,(quint8)(in_stack_ffffffffffffff8c >> 0x18))
      ;
    }
    pQVar2 = in_RDI;
    QHostAddress::scopeId((QHostAddress *)in_RDI);
    operator<<(pQVar2,(QString *)local_30);
    QString::~QString((QString *)0x2188e1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QHostAddress &address)
{
    qint8 prot;
    prot = qint8(address.protocol());
    out << prot;
    switch (address.protocol()) {
    case QHostAddress::UnknownNetworkLayerProtocol:
    case QHostAddress::AnyIPProtocol:
        break;
    case QHostAddress::IPv4Protocol:
        out << address.toIPv4Address();
        break;
    case QHostAddress::IPv6Protocol:
    {
        Q_IPV6ADDR ipv6 = address.toIPv6Address();
        for (int i = 0; i < 16; ++i)
            out << ipv6[i];
        out << address.scopeId();
    }
        break;
    }
    return out;
}